

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
               (void)

{
  uint uVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_false>
  _Var3;
  pointer pvVar4;
  Column_zp_settings *this;
  undefined4 uVar5;
  _Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_false>
  __it;
  undefined4 local_238;
  int local_234;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  undefined1 *local_218;
  int *local_210;
  undefined1 local_208;
  undefined8 local_200;
  shared_count sStack_1f8;
  undefined **local_1f0;
  undefined1 local_1e8;
  undefined8 *local_1e0;
  int **local_1d8;
  undefined **local_1d0;
  undefined1 local_1c8;
  undefined8 *local_1c0;
  undefined1 **local_1b8;
  char *local_1b0;
  char *local_1a8;
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
  m;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  m.colSettings_ = this;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
              *)&m.matrix_,&columns,this);
  ppVar2 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
            (&columns,&m);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x36f);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_001e80d0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_210 = &local_234;
  local_234 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_238 = 7;
  local_208 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 7;
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1d8 = &local_210;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001e8040;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_218;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_001e8090;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_218 = (undefined1 *)&local_238;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  if (m.matrix_.nextEventIndex_ != 0) {
    m.matrix_.nextEventIndex_ = m.matrix_.nextEventIndex_ - 1;
    if (m.matrix_.mirrorMatrixU_.nextInsertIndex_ != 0) {
      m.matrix_.mirrorMatrixU_.nextInsertIndex_ = m.matrix_.mirrorMatrixU_.nextInsertIndex_ - 1;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase();
    }
    if (m.matrix_.reducedMatrixR_.nextInsertIndex_ == 0) {
      uVar5 = 0xffffffff;
    }
    else {
      m.matrix_.reducedMatrixR_.nextInsertIndex_ = m.matrix_.reducedMatrixR_.nextInsertIndex_ - 1;
      __it._M_cur = (__node_type *)0x0;
      if ((m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
           [(ulong)m.matrix_.reducedMatrixR_.nextInsertIndex_ %
            m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count] != (__node_base_ptr)0x0) &&
         (__it._M_cur = (__node_type *)
                        m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                        [(ulong)m.matrix_.reducedMatrixR_.nextInsertIndex_ %
                         m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count]->_M_nxt,
         m.matrix_.reducedMatrixR_.nextInsertIndex_ !=
         *(uint *)&((__it._M_cur)->
                   super__Hash_node_value<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>
                   ._M_storage._M_storage)) {
        while (_Var3._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt,
              _Var3._M_cur != (__node_type *)0x0) {
          uVar1 = *(uint *)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>
                            ._M_storage._M_storage;
          __it._M_cur = (__node_type *)0x0;
          if (((ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count !=
               (ulong)m.matrix_.reducedMatrixR_.nextInsertIndex_ %
               m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count) ||
             (__it._M_cur = _Var3._M_cur, m.matrix_.reducedMatrixR_.nextInsertIndex_ == uVar1))
          goto LAB_00173003;
        }
        __it._M_cur = (__node_type *)0x0;
      }
LAB_00173003:
      uVar5 = 0xffffffff;
      if (*(long *)((long)__it._M_cur + 0x28) != (long)__it._M_cur + 0x28 &&
          *(long *)((long)__it._M_cur + 0x28) != 0) {
        uVar5 = *(undefined4 *)(*(long *)((long)__it._M_cur + 0x30) + 0x10);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)&m.matrix_.reducedMatrixR_,(const_iterator)__it._M_cur);
    }
    local_1f0 = (undefined **)CONCAT44(local_1f0._4_4_,uVar5);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&m.matrix_.pivotToColumnIndex_._M_h);
  }
  ppVar2 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar2 != (pointer)0x0) {
    pvVar4 = columns.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar2,(long)(pvVar4->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2)
    ;
    pvVar4 = columns.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
            (&columns,&m);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x37c);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_001e80d0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_234 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_208 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 6;
  local_238 = 6;
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_210 = &local_234;
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001e8040;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_210;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_001e8090;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_218;
  local_218 = (undefined1 *)&local_238;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_ru_maximal_simplex_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  columns[5].clear();

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);
  }

  if constexpr (Matrix::Option_list::has_vine_update) {
    m.remove_maximal_cell(6);
  } else {
    m.remove_last();
  }

  columns.pop_back();
  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death,
                      Matrix::template get_null_value<typename Matrix::ID_index>());
  }
}